

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextVkImpl::WaitForIdle(DeviceContextVkImpl *this)

{
  bool bVar1;
  SoftwareQueueIndex QueueInd;
  Char *Message;
  RenderDeviceVkImpl *this_00;
  undefined1 local_30 [8];
  string msg;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = this;
  bVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsDeferred
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  if (bVar1) {
    FormatString<char[37]>((string *)local_30,(char (*) [37])"Only immediate contexts can be idled")
    ;
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"WaitForIdle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb3e);
    std::__cxx11::string::~string((string *)local_30);
  }
  Flush(this);
  this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                      (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  QueueInd = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                       (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::IdleCommandQueue(&this_00->
                      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                     ,QueueInd,true);
  return;
}

Assistant:

void DeviceContextVkImpl::WaitForIdle()
{
    DEV_CHECK_ERR(!IsDeferred(), "Only immediate contexts can be idled");
    Flush();
    m_pDevice->IdleCommandQueue(GetCommandQueueId(), true);
}